

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy.cpp
# Opt level: O2

json read_json_from_file(path *path)

{
  json_value extraout_RDX;
  path *in_RSI;
  json jVar1;
  ifstream config_file;
  
  std::ifstream::ifstream(&config_file);
  std::ios::exceptions((int)&config_file + (int)*(undefined8 *)(_config_file + -0x18));
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            (&config_file,in_RSI,_S_in);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)path,(nullptr_t)0x0);
  nlohmann::operator>>
            ((istream *)&config_file,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)path);
  std::ifstream::~ifstream(&config_file);
  jVar1.m_value.object = extraout_RDX.object;
  jVar1._0_8_ = path;
  return jVar1;
}

Assistant:

json read_json_from_file(const std::filesystem::path& path)
{
    std::ifstream config_file;
    config_file.exceptions(std::ios::badbit | std::ios::failbit);
    config_file.open(path);
    json config;
    config_file >> config;
    return config;
}